

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAabbUtil2.h
# Opt level: O2

void cbtTransformAabb(cbtVector3 *localAabbMin,cbtVector3 *localAabbMax,cbtScalar margin,
                     cbtTransform *trans,cbtVector3 *aabbMinOut,cbtVector3 *aabbMaxOut)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  cbtVector3 cVar17;
  cbtVector3 cVar18;
  cbtVector3 localCenter;
  cbtMatrix3x3 abs_b;
  cbtVector3 local_80;
  cbtVector3 local_70;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar11 [56];
  undefined1 auVar15 [56];
  undefined1 auVar16 [56];
  
  auVar10 = in_register_00001204._4_56_;
  cVar17 = operator-(localAabbMax,localAabbMin);
  auVar6._0_8_ = cVar17.m_floats._0_8_;
  auVar6._8_56_ = auVar10;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar3 = vmulps_avx512vl(auVar6._0_16_,auVar3);
  fVar1 = cVar17.m_floats[2] * 0.5;
  auVar4._0_4_ = auVar3._0_4_ + margin;
  auVar4._4_4_ = auVar3._4_4_ + margin;
  auVar4._8_4_ = auVar3._8_4_ + margin;
  auVar4._12_4_ = auVar3._12_4_ + margin;
  auVar3 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x28);
  auVar10 = (undefined1  [56])0x0;
  local_70.m_floats[3] = auVar3._12_4_;
  local_70.m_floats._0_8_ = auVar3._0_8_;
  local_70.m_floats[2] = fVar1 + margin;
  cVar17 = operator+(localAabbMax,localAabbMin);
  auVar7._0_8_ = cVar17.m_floats._0_8_;
  auVar7._8_56_ = auVar10;
  auVar2._8_4_ = 0x3f000000;
  auVar2._0_8_ = 0x3f0000003f000000;
  auVar2._12_4_ = 0x3f000000;
  auVar3 = vmulps_avx512vl(auVar7._0_16_,auVar2);
  auVar15 = (undefined1  [56])0x0;
  local_80.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar3,ZEXT416((uint)(cVar17.m_floats[2] * 0.5)),0x28);
  auVar11 = ZEXT856(local_80.m_floats._8_8_);
  cbtMatrix3x3::absolute(&trans->m_basis);
  cVar17 = cbtTransform::operator()(trans,&local_80);
  auVar13._0_8_ = cVar17.m_floats._8_8_;
  auVar13._8_56_ = auVar15;
  auVar8._0_8_ = cVar17.m_floats._0_8_;
  auVar8._8_56_ = auVar11;
  auVar10 = auVar11;
  auVar16 = auVar15;
  cVar18 = cbtVector3::dot3(&local_70,&local_60,&local_50,&local_40);
  auVar14._0_8_ = cVar18.m_floats._8_8_;
  auVar14._8_56_ = auVar16;
  auVar9._0_8_ = cVar18.m_floats._0_8_;
  auVar9._8_56_ = auVar10;
  auVar3 = vsubps_avx(auVar8._0_16_,auVar9._0_16_);
  auVar2 = vsubps_avx(auVar13._0_16_,auVar14._0_16_);
  auVar5._0_4_ = cVar17.m_floats[0] + cVar18.m_floats[0];
  auVar5._4_4_ = cVar17.m_floats[1] + cVar18.m_floats[1];
  auVar5._8_4_ = auVar11._0_4_ + auVar10._0_4_;
  auVar5._12_4_ = auVar11._4_4_ + auVar10._4_4_;
  auVar12._0_4_ = cVar17.m_floats[2] + cVar18.m_floats[2];
  auVar12._4_4_ = cVar17.m_floats[3] + cVar18.m_floats[3];
  auVar12._8_4_ = auVar15._0_4_ + auVar16._0_4_;
  auVar12._12_4_ = auVar15._4_4_ + auVar16._4_4_;
  auVar3 = vinsertps_avx(auVar3,auVar2,0x28);
  auVar2 = vinsertps_avx(auVar5,auVar12,0x28);
  *(undefined1 (*) [16])aabbMinOut->m_floats = auVar3;
  *(undefined1 (*) [16])aabbMaxOut->m_floats = auVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE void cbtTransformAabb(const cbtVector3& localAabbMin, const cbtVector3& localAabbMax, cbtScalar margin, const cbtTransform& trans, cbtVector3& aabbMinOut, cbtVector3& aabbMaxOut)
{
	cbtAssert(localAabbMin.getX() <= localAabbMax.getX());
	cbtAssert(localAabbMin.getY() <= localAabbMax.getY());
	cbtAssert(localAabbMin.getZ() <= localAabbMax.getZ());
	cbtVector3 localHalfExtents = cbtScalar(0.5) * (localAabbMax - localAabbMin);
	localHalfExtents += cbtVector3(margin, margin, margin);

	cbtVector3 localCenter = cbtScalar(0.5) * (localAabbMax + localAabbMin);
	cbtMatrix3x3 abs_b = trans.getBasis().absolute();
	cbtVector3 center = trans(localCenter);
	cbtVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMinOut = center - extent;
	aabbMaxOut = center + extent;
}